

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_method.cpp
# Opt level: O0

void mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm
               (MPI_Comm cart_comm,int ndims,int *stencil,int num_neighbors,int *dims,int *periods,
               MPI_Comm *dist_graph_comm)

{
  long lVar1;
  MPI_Comm poVar2;
  uint uVar3;
  long lVar4;
  unsigned_long uVar5;
  int iVar6;
  size_type sVar7;
  int *piVar8;
  undefined8 auStackY_d0 [2];
  undefined8 uStackY_c0;
  undefined4 auStack_a8 [2];
  MPI_Comm local_a0;
  uint local_94;
  long local_90;
  vector<int,_std::allocator<int>_> *local_88;
  uint local_80;
  int local_7c;
  int n_vertices_to_specify;
  int i;
  unsigned_long __vla_expr0;
  int local_68 [2];
  int real_neighbors_size;
  undefined1 auStack_58 [8];
  vector<int,_std::allocator<int>_> real_neighbors;
  int cart_rank;
  int *periods_local;
  int *dims_local;
  int num_neighbors_local;
  int *stencil_local;
  int ndims_local;
  MPI_Comm cart_comm_local;
  
  MPI_Comm_rank(cart_comm,
                (undefined1 *)
                ((long)&real_neighbors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4));
  auStack_58 = (undefined1  [8])0x0;
  real_neighbors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  real_neighbors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88 = (vector<int,_std::allocator<int>_> *)auStack_58;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27cc8e);
  uStackY_c0 = 0x27ccbf;
  get_neighbors_from_stencil
            (cart_comm,
             real_neighbors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,ndims,stencil,num_neighbors,dims,
             periods,local_88);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)auStack_58);
  iVar6 = (int)sVar7;
  local_68[0] = iVar6;
  __vla_expr0 = (unsigned_long)auStack_a8;
  lVar1 = -((sVar7 & 0xffffffff) * 4 + 0xf & 0xfffffffffffffff0);
  local_90 = (long)auStack_a8 + lVar1;
  _n_vertices_to_specify = sVar7 & 0xffffffff;
  for (local_7c = 0; local_7c < iVar6; local_7c = local_7c + 1) {
    *(undefined4 *)((long)auStack_a8 + lVar1 + (long)local_7c * 4) = 0;
  }
  local_80 = 0;
  if (iVar6 != 0) {
    local_80 = 1;
  }
  local_80 = (uint)(iVar6 != 0);
  local_a0 = cart_comm;
  local_94 = local_80;
  *(undefined8 *)(&stack0xffffffffffffff50 + lVar1) = 0x27cd72;
  piVar8 = std::vector<int,_std::allocator<int>_>::data
                     (*(vector<int,_std::allocator<int>_> **)(&stack0xffffffffffffff50 + lVar1));
  lVar4 = local_90;
  uVar3 = local_94;
  poVar2 = local_a0;
  *(MPI_Comm **)(&stack0xffffffffffffff48 + lVar1) = dist_graph_comm;
  *(undefined **)((long)auStackY_d0 + lVar1 + 8) = &ompi_mpi_info_null;
  *(undefined4 *)((long)&uStackY_c0 + lVar1) = 0;
  *(undefined8 *)((long)auStackY_d0 + lVar1) = 0x27cdb6;
  MPI_Dist_graph_create
            (poVar2,uVar3,
             (undefined1 *)
             ((long)&real_neighbors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),local_68,piVar8,lVar4);
  uVar5 = __vla_expr0;
  *(undefined8 *)(__vla_expr0 - 8) = 0x27cdcc;
  std::vector<int,_std::allocator<int>_>::~vector
            (*(vector<int,_std::allocator<int>_> **)(uVar5 + 0x18));
  return;
}

Assistant:

void mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm(MPI_Comm cart_comm, const int ndims,
															 const int stencil[],
															 const int num_neighbors,
															 const int dims[],
															 const int periods[],
															 MPI_Comm *dist_graph_comm) {

  int cart_rank;
  MPI_Comm_rank(cart_comm, &cart_rank);
  std::vector<int> real_neighbors{};
  mpireorderinglib::get_neighbors_from_stencil(cart_comm, cart_rank,
											   ndims, stencil, num_neighbors, dims,
											   periods, real_neighbors);

  int real_neighbors_size = real_neighbors.size();
  int weights[real_neighbors_size];
  for (int i{0}; i < real_neighbors_size; i++) weights[i] = 0;

  int n_vertices_to_specify{0};
  if (real_neighbors_size) n_vertices_to_specify = 1;

  MPI_Dist_graph_create(cart_comm,
						n_vertices_to_specify,
						&cart_rank,
						&real_neighbors_size,
						real_neighbors.data(),
						weights,
						MPI_INFO_NULL,
						0,
						dist_graph_comm);
}